

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O3

ColumnRef __thiscall clickhouse::ColumnUUID::Slice(ColumnUUID *this,size_t begin,size_t len)

{
  element_type *peVar1;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ColumnRef CVar3;
  undefined1 local_39;
  _func_int **local_38;
  element_type *peStack_30;
  shared_ptr<clickhouse::Column> local_20;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))
            (&local_20,*(long **)(begin + 0x28),len * 2,in_RCX * 2);
  std::__shared_ptr<clickhouse::ColumnUUID,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<clickhouse::ColumnUUID>,std::shared_ptr<clickhouse::Column>>
            ((__shared_ptr<clickhouse::ColumnUUID,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<clickhouse::ColumnUUID> *)&local_39,&local_20);
  peVar1 = peStack_30;
  peStack_30 = (element_type *)0x0;
  (this->super_Column)._vptr_Column = local_38;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_38 = (_func_int **)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnUUID::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnUUID>(data_->Slice(begin * 2, len * 2));
}